

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  ImVec2 *pIVar1;
  ImGuiWindow **ppIVar2;
  double *pdVar3;
  double dVar4;
  short sVar5;
  uint uVar6;
  ImGuiContext *pIVar7;
  ImGuiWindow *pIVar8;
  int iVar9;
  ImGuiViewportP *pIVar10;
  byte bVar11;
  ImGuiWindow *pIVar12;
  byte bVar13;
  byte bVar14;
  ImVec2 IVar15;
  ImGuiWindow *pIVar16;
  long lVar17;
  float fVar18;
  int iVar19;
  ImGuiWindow *pIVar20;
  bool bVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  
  pIVar7 = GImGui;
  pIVar8 = GImGui->MovingWindow;
  if (pIVar8 == (ImGuiWindow *)0x0) {
    pIVar10 = (ImGuiViewportP *)0x0;
    pIVar12 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar10 = pIVar8->Viewport;
    pIVar8->Viewport = GImGui->MouseViewport;
    pIVar12 = (ImGuiWindow *)0x0;
    if ((pIVar8->Flags & 0x200) == 0) {
      pIVar12 = pIVar8;
    }
  }
  pIVar1 = &(pIVar7->Style).TouchExtraPadding;
  IVar15 = *pIVar1;
  if ((pIVar7->IO).ConfigWindowsResizeFromEdges == true) {
    fVar22 = (pIVar7->Style).TouchExtraPadding.x;
    fVar23 = (pIVar7->Style).TouchExtraPadding.y;
    if (fVar22 <= 4.0) {
      fVar22 = 4.0;
    }
    if (fVar23 <= 4.0) {
      fVar23 = 4.0;
    }
    IVar15.y = fVar23;
    IVar15.x = fVar22;
  }
  lVar17 = (long)(pIVar7->Windows).Size;
  if (lVar17 < 1) {
    pIVar16 = (ImGuiWindow *)0x0;
  }
  else {
    lVar17 = lVar17 + 1;
    pIVar16 = (ImGuiWindow *)0x0;
    do {
      pIVar20 = (pIVar7->Windows).Data[lVar17 + -2];
      bVar21 = false;
      if (((pIVar20->Active == true) && (pIVar20->Hidden == false)) &&
         (uVar6 = pIVar20->Flags, (uVar6 >> 9 & 1) == 0)) {
        if (pIVar20->Viewport == (ImGuiViewportP *)0x0) {
          __assert_fail("window->Viewport",
                        "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                        ,0x1220,"void FindHoveredWindow()");
        }
        if (pIVar20->Viewport == pIVar7->MouseViewport) {
          fVar22 = pIVar1->x;
          if ((uVar6 & 0x1000042) == 0) {
            fVar22 = IVar15.x;
          }
          fVar23 = (pIVar7->IO).MousePos.x;
          if ((pIVar20->OuterRectClipped).Min.x - fVar22 <= fVar23) {
            fVar18 = (pIVar7->Style).TouchExtraPadding.y;
            if ((uVar6 & 0x1000042) == 0) {
              fVar18 = IVar15.y;
            }
            fVar24 = (pIVar7->IO).MousePos.y;
            if ((((pIVar20->OuterRectClipped).Min.y - fVar18 <= fVar24) &&
                (fVar23 < fVar22 + (pIVar20->OuterRectClipped).Max.x)) &&
               (fVar24 < fVar18 + (pIVar20->OuterRectClipped).Max.y)) {
              sVar5 = (pIVar20->HitTestHoleSize).x;
              if (sVar5 != 0) {
                iVar19 = (int)(pIVar20->HitTestHoleOffset).x;
                fVar23 = fVar23 - (pIVar20->Pos).x;
                if ((float)iVar19 <= fVar23) {
                  fVar24 = fVar24 - (pIVar20->Pos).y;
                  iVar9 = (int)(pIVar20->HitTestHoleOffset).y;
                  bVar21 = fVar24 < (float)((pIVar20->HitTestHoleSize).y + iVar9) &&
                           (fVar23 < (float)(iVar19 + sVar5) && (float)iVar9 <= fVar24);
                }
                else {
                  bVar21 = false;
                }
                if (bVar21) {
                  bVar21 = false;
                  goto LAB_001d3281;
                }
              }
              if (pIVar12 == (ImGuiWindow *)0x0) {
                pIVar12 = pIVar20;
              }
              if (((pIVar16 == (ImGuiWindow *)0x0) &&
                  (pIVar16 = pIVar20, pIVar8 != (ImGuiWindow *)0x0)) &&
                 (pIVar20->RootWindow == pIVar8->RootWindow)) {
                pIVar16 = (ImGuiWindow *)0x0;
              }
              bVar21 = pIVar16 != (ImGuiWindow *)0x0 && pIVar12 != (ImGuiWindow *)0x0;
            }
          }
        }
      }
LAB_001d3281:
    } while ((!bVar21) && (lVar17 = lVar17 + -1, 1 < lVar17));
  }
  pIVar7->HoveredWindow = pIVar12;
  if (pIVar12 == (ImGuiWindow *)0x0) {
    pIVar20 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar20 = pIVar12->RootWindow;
  }
  pIVar7->HoveredRootWindow = pIVar20;
  pIVar7->HoveredWindowUnderMovingWindow = pIVar16;
  if (pIVar8 != (ImGuiWindow *)0x0) {
    pIVar8->Viewport = pIVar10;
  }
  if ((pIVar12 != pIVar8 && pIVar12 != (ImGuiWindow *)0x0) &&
     (pIVar12->Viewport != pIVar7->MouseViewport)) {
    __assert_fail("g.HoveredWindow == __null || g.HoveredWindow == g.MovingWindow || g.HoveredWindow->Viewport == g.MouseViewport"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                  ,0xee5,"void ImGui::UpdateHoveredWindowAndCaptureFlags()");
  }
  ppIVar2 = &pIVar7->HoveredWindow;
  pIVar8 = GetTopMostPopupModal();
  if (((pIVar8 != (ImGuiWindow *)0x0) && (pIVar20 != (ImGuiWindow *)0x0)) &&
     (pIVar20->RootWindow != pIVar8)) {
    do {
      if (pIVar20 == pIVar8) goto LAB_001d3328;
      pIVar20 = pIVar20->ParentWindow;
    } while (pIVar20 != (ImGuiWindow *)0x0);
    *ppIVar2 = (ImGuiWindow *)0x0;
    pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar7->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
  }
LAB_001d3328:
  uVar6 = (pIVar7->IO).ConfigFlags;
  if ((uVar6 & 0x10) != 0) {
    *ppIVar2 = (ImGuiWindow *)0x0;
    pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar7->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
  }
  iVar19 = -1;
  lVar17 = 0;
  bVar11 = 0;
  do {
    if ((pIVar7->IO).MouseClicked[lVar17] == true) {
      bVar21 = true;
      if (*ppIVar2 == (ImGuiWindow *)0x0) {
        bVar21 = 0 < (pIVar7->OpenPopupStack).Size;
      }
      (pIVar7->IO).MouseDownOwned[lVar17] = bVar21;
    }
    bVar21 = (pIVar7->IO).MouseDown[lVar17];
    if ((bVar21 == true) &&
       ((iVar19 == -1 ||
        (dVar4 = (pIVar7->IO).MouseClickedTime[iVar19],
        pdVar3 = (pIVar7->IO).MouseClickedTime + lVar17, *pdVar3 <= dVar4 && dVar4 != *pdVar3)))) {
      iVar19 = (int)lVar17;
    }
    bVar11 = bVar11 & 1 | bVar21;
    lVar17 = lVar17 + 1;
  } while (lVar17 != 5);
  if (iVar19 == -1) {
    bVar13 = 1;
  }
  else {
    bVar13 = (pIVar7->IO).MouseDownOwned[iVar19];
  }
  if (pIVar7->DragDropActive == true) {
    bVar14 = ((byte)pIVar7->DragDropSourceFlags & 0x10) >> 4;
  }
  else {
    bVar14 = 0;
  }
  if (bVar14 == 0 && (bVar13 & 1) == 0) {
    *ppIVar2 = (ImGuiWindow *)0x0;
    pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar7->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
  }
  if (pIVar7->WantCaptureMouseNextFrame == -1) {
    if ((bVar13 == 0) || ((bVar21 = true, *ppIVar2 == (ImGuiWindow *)0x0 && (bVar11 == 0)))) {
      bVar21 = 0 < (pIVar7->OpenPopupStack).Size;
    }
    (pIVar7->IO).WantCaptureMouse = bVar21;
  }
  else {
    (pIVar7->IO).WantCaptureMouse = pIVar7->WantCaptureMouseNextFrame != 0;
  }
  if (pIVar7->WantCaptureKeyboardNextFrame == -1) {
    bVar21 = pIVar7->ActiveId != 0 || pIVar8 != (ImGuiWindow *)0x0;
  }
  else {
    bVar21 = pIVar7->WantCaptureKeyboardNextFrame != 0;
  }
  (pIVar7->IO).WantCaptureKeyboard = bVar21;
  if (((uVar6 & 9) == 1) && ((pIVar7->IO).NavActive != false)) {
    (pIVar7->IO).WantCaptureKeyboard = true;
  }
  (pIVar7->IO).WantTextInput = pIVar7->WantTextInputNextFrame - 1U < 0xfffffffe;
  return;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    FindHoveredWindow();
    IM_ASSERT(g.HoveredWindow == NULL || g.HoveredWindow == g.MovingWindow || g.HoveredWindow->Viewport == g.MouseViewport);

    // Modal windows prevents cursor from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window)
        if (g.HoveredRootWindow && !IsWindowChildOf(g.HoveredRootWindow, modal_window))
            g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (g.OpenPopupStack.Size > 0);
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to Dear ImGui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (g.OpenPopupStack.Size > 0);

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to Dear ImGui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}